

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  long lVar1;
  int errcode;
  long in_FS_OFFSET;
  DbPath path;
  char zPwd [4098];
  DbPath local_1050;
  char local_1038 [4112];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1050.rc = 0;
  local_1050.nSymlink = 0;
  local_1050.nUsed = 0;
  local_1050.zOut = zOut;
  local_1050.nOut = nOut;
  if (*zPath != '/') {
    lVar1 = (*aSyscall[3].pCurrent)(local_1038,0x1000);
    if (lVar1 == 0) {
      errcode = sqlite3CantopenError(0xa42e);
      unixLogErrorAtLine(errcode,"getcwd",zPath,0xa42e);
      goto LAB_00116d74;
    }
    appendAllPathElements(&local_1050,local_1038);
  }
  appendAllPathElements(&local_1050,zPath);
  zOut[local_1050.nUsed] = '\0';
  if (((long)local_1050.nUsed < 2) || (local_1050.rc != 0)) {
    errcode = sqlite3CantopenError(0xa434);
  }
  else {
    errcode = (uint)(local_1050.nSymlink != 0) << 9;
  }
LAB_00116d74:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return errcode;
  }
  __stack_chk_fail();
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  DbPath path;
  UNUSED_PARAMETER(pVfs);
  path.rc = 0;
  path.nUsed = 0;
  path.nSymlink = 0;
  path.nOut = nOut;
  path.zOut = zOut;
  if( zPath[0]!='/' ){
    char zPwd[SQLITE_MAX_PATHLEN+2];
    if( osGetcwd(zPwd, sizeof(zPwd)-2)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    appendAllPathElements(&path, zPwd);
  }
  appendAllPathElements(&path, zPath);
  zOut[path.nUsed] = 0;
  if( path.rc || path.nUsed<2 ) return SQLITE_CANTOPEN_BKPT;
  if( path.nSymlink ) return SQLITE_OK_SYMLINK;
  return SQLITE_OK;
}